

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O1

void Curl_ssl_kill_session(curl_ssl_session *session)

{
  if (session->sessionid != (void *)0x0) {
    (*Curl_ssl->session_free)(session->sessionid);
    session->sessionid = (void *)0x0;
    session->age = 0;
    Curl_free_primary_ssl_config(&session->ssl_config);
    (*Curl_cfree)(session->name);
    session->name = (char *)0x0;
    (*Curl_cfree)(session->conn_to_host);
    session->conn_to_host = (char *)0x0;
  }
  return;
}

Assistant:

void Curl_ssl_kill_session(struct curl_ssl_session *session)
{
  if(session->sessionid) {
    /* defensive check */

    /* free the ID the SSL-layer specific way */
    Curl_ssl->session_free(session->sessionid);

    session->sessionid = NULL;
    session->age = 0; /* fresh */

    Curl_free_primary_ssl_config(&session->ssl_config);

    Curl_safefree(session->name);
    Curl_safefree(session->conn_to_host);
  }
}